

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gga_k_apbe.c
# Opt level: O2

void gga_k_apbe_init(xc_func_type *p)

{
  int iVar1;
  undefined8 *puVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  
  puVar2 = (undefined8 *)malloc(0x20);
  p->params = puVar2;
  iVar1 = p->info->number;
  if (iVar1 == 0x36) {
    uVar3 = 0x353f7cee;
    uVar4 = 0x3fe9ba5e;
  }
  else {
    if (iVar1 != 0x35) {
      fwrite("Internal error in gga_k_apbeint\n",0x20,1,_stderr);
      exit(1);
    }
    uVar3 = 0x1eb851ec;
    uVar4 = 0x3ff3eb85;
  }
  *puVar2 = CONCAT44(uVar4,uVar3);
  puVar2[1] = 0x3ffaaaaaaaaaaaab;
  puVar2[2] = 0x3fce97396d0917d7;
  puVar2[3] = 0x3fc7b425ed097b42;
  return;
}

Assistant:

static void
gga_k_apbe_init(xc_func_type *p)
{
  gga_k_apbe_params *params;

  assert(p!=NULL && p->params == NULL);
  p->params = libxc_malloc(sizeof(gga_k_apbe_params));
  params = (gga_k_apbe_params *) (p->params);

  params->lambda = 0.0;

  switch(p->info->number){
  case XC_GGA_K_APBE:
    params->kappa = 0.8040;
    params->mu    = 0.23889;
    break;
  case XC_GGA_K_TW1:
    params->kappa = 0.8209;
    params->mu    = 0.2335;
    break;
  case XC_GGA_K_TW2:
    params->kappa = 0.6774;
    params->mu    = 0.2371;
    break;
  case XC_GGA_K_TW3:
    params->kappa = 0.8438;
    params->mu    = 0.2319;
    break;
  case XC_GGA_K_TW4:
    params->kappa = 0.8589;
    params->mu    = 0.2309;
    break;
  case XC_GGA_K_REVAPBE:
    params->kappa = 1.245;
    params->mu    = 0.23889;
    break;
  default:
    fprintf(stderr, "Internal error in gga_k_apbe\n");
    exit(1);
  }
}